

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1Plane3Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi,Matrix<float,_4,_1,_0,_4,_1> *Nu
          ,bool verbose)

{
  Scalar SVar1;
  Scalar *pSVar2;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar4;
  ostream *poVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  XprTypeNested local_2c8;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_2c0;
  Type local_2b0;
  Type local_278;
  IdentityReturnType local_23f;
  float local_23c;
  Scalar local_238;
  Scalar local_234;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_230;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  Scalar local_1ec;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_1e8;
  XprTypeNested local_1c8;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1c0;
  Type local_1b0;
  Type local_178;
  IdentityReturnType local_13f;
  float local_13c;
  Scalar local_138;
  Scalar local_134;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_130;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  Scalar local_ec;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_e8;
  Scalar local_c4;
  Scalar local_c0;
  float nu14;
  float nu13;
  float nu12;
  float nu11;
  float pi14;
  float pi13;
  float pi12;
  float pi11;
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  undefined1 local_68 [8];
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  bool verbose_local;
  Matrix<float,_4,_1,_0,_4,_1> *Nu_local;
  Matrix<float,_4,_1,_0,_4,_1> *Pi_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *outTrans;
  
  auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf].
  _2_1_ = 0;
  auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf].
  _3_1_ = verbose;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_68);
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)&pi12);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi,0);
  pi13 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi,1);
  pi14 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi,2);
  nu11 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi,3);
  nu12 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu,0);
  nu13 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu,1);
  nu14 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu,2);
  local_c0 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu,3);
  local_c4 = *pSVar2;
  local_ec = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
            (&local_e8,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),&local_ec);
  fVar6 = -nu11;
  dVar7 = std::sqrt((double)(ulong)(uint)(pi14 * pi14 + nu11 * nu11));
  local_f0 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_e8,&local_f0);
  fVar6 = pi14;
  dVar7 = std::sqrt((double)(ulong)(uint)(pi14 * pi14 + nu11 * nu11));
  local_f4 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_f4);
  dVar7 = std::sqrt((double)(ulong)(uint)(pi14 * pi14 + nu11 * nu11));
  dVar8 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_f8 = SUB84(dVar7,0) / SUB84(dVar8,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_f8);
  fVar6 = -pi13 * pi14;
  dVar7 = std::sqrt((double)(ulong)(uint)(pi14 * pi14 + nu11 * nu11));
  dVar8 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_fc = (fVar6 / SUB84(dVar7,0)) / SUB84(dVar8,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_fc);
  fVar6 = -pi13 * nu11;
  dVar7 = std::sqrt((double)(ulong)(uint)(pi14 * pi14 + nu11 * nu11));
  dVar8 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_100 = (fVar6 / SUB84(dVar7,0)) / SUB84(dVar8,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_100);
  fVar6 = pi13;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_104 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_104);
  fVar6 = pi14;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_108 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_108);
  fVar6 = nu11;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_10c = fVar6 / SUB84(dVar7,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_10c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_e8);
  local_134 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_130,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12,&local_134);
  local_138 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     (&local_130,&local_138);
  fVar6 = nu12;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu11 * nu11 + pi13 * pi13 + pi14 * pi14));
  local_13c = fVar6 * SUB84(dVar7,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_13c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_130);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity(&local_13f,4,4);
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_68,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&local_13f);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_178,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_68,3,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_178,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_1b0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_68,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_1b0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12);
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_68);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1c8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_68);
    local_1c0 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)&local_1c8,
                           (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_68);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_1c0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_68);
  local_1ec = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
            (&local_1e8,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),&local_1ec);
  fVar6 = -local_c0;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu14 * nu14 + local_c0 * local_c0));
  local_1f0 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_1e8,&local_1f0);
  fVar6 = nu14;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu14 * nu14 + local_c0 * local_c0));
  local_1f4 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_1f4);
  dVar7 = std::sqrt((double)(ulong)(uint)(nu14 * nu14 + local_c0 * local_c0));
  dVar8 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_1f8 = SUB84(dVar7,0) / SUB84(dVar8,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_1f8);
  fVar6 = -nu13 * nu14;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu14 * nu14 + local_c0 * local_c0));
  dVar8 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_1fc = (fVar6 / SUB84(dVar7,0)) / SUB84(dVar8,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_1fc);
  fVar6 = -nu13 * local_c0;
  dVar7 = std::sqrt((double)(ulong)(uint)(nu14 * nu14 + local_c0 * local_c0));
  dVar8 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_200 = (fVar6 / SUB84(dVar7,0)) / SUB84(dVar8,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_200);
  fVar6 = nu13;
  dVar7 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_204 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_204);
  fVar6 = nu14;
  dVar7 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_208 = fVar6 / SUB84(dVar7,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_208);
  SVar1 = local_c0;
  dVar7 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_20c = SVar1 / SUB84(dVar7,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_20c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1e8);
  local_234 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_230,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12,&local_234);
  local_238 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     (&local_230,&local_238);
  SVar1 = local_c4;
  dVar7 = std::sqrt((double)(ulong)(uint)(local_c0 * local_c0 + nu13 * nu13 + nu14 * nu14));
  local_23c = SVar1 * SUB84(dVar7,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_23c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_230);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity(&local_23f,4,4);
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_68,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&local_23f);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_278,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_68,3,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_278,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_2b0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_68,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_2b0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12);
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_68);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_2c8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_68);
    local_2c0 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)&local_2c8,
                           (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_68);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_2c0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_68);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations1Plane3Line(
	Matrix<floatPrec, 4, 1> Pi, Matrix<floatPrec, 4, 1> Nu,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec nu11, nu12, nu13, nu14;

	pi11 = Pi(0);
	pi12 = Pi(1);
	pi13 = Pi(2);
	pi14 = Pi(3);
	nu11 = Nu(0);
	nu12 = Nu(1);
	nu13 = Nu(2);
	nu14 = Nu(3);

	// Compute U Matrix
	auxRot << 0.0,
		-pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0, 0.0, pi14 * sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 0.0,
		-nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0, 0.0, nu14 * sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}